

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

size_t HistogramSetTotalSize(int size,int cache_bits)

{
  int iVar1;
  int in_EDI;
  int histo_size;
  int in_stack_fffffffffffffff4;
  
  iVar1 = GetHistogramSize(in_stack_fffffffffffffff4);
  return (long)in_EDI * ((long)iVar1 + 0x27) + 0x10;
}

Assistant:

static size_t HistogramSetTotalSize(int size, int cache_bits) {
  const int histo_size = GetHistogramSize(cache_bits);
  return (sizeof(VP8LHistogramSet) + size * (sizeof(VP8LHistogram*) +
          histo_size + WEBP_ALIGN_CST));
}